

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::Link::~Link(Link *this)

{
  undefined8 *in_RDI;
  vector<diy::BlockID,_std::allocator<diy::BlockID>_> *in_stack_00000010;
  
  *in_RDI = &PTR_id_abi_cxx11__001d97e8;
  std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::~vector(in_stack_00000010);
  return;
}

Assistant:

Link&     operator=(Link&&)                   = default;